

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_real.c
# Opt level: O0

HPDF_Real HPDF_Real_New(HPDF_MMgr mmgr,HPDF_REAL value)

{
  HPDF_Real obj_00;
  HPDF_Real obj;
  HPDF_REAL value_local;
  HPDF_MMgr mmgr_local;
  
  obj_00 = (HPDF_Real)HPDF_GetMem(mmgr,0x18);
  if (obj_00 != (HPDF_Real)0x0) {
    HPDF_MemSet(obj_00,'\0',8);
    (obj_00->header).obj_class = 5;
    obj_00->error = mmgr->error;
    HPDF_Real_SetValue(obj_00,value);
  }
  return obj_00;
}

Assistant:

HPDF_Real
HPDF_Real_New  (HPDF_MMgr  mmgr,
                HPDF_REAL  value)
{
    HPDF_Real obj = HPDF_GetMem (mmgr, sizeof(HPDF_Real_Rec));

    if (obj) {
        HPDF_MemSet (&obj->header, 0, sizeof(HPDF_Obj_Header));
        obj->header.obj_class = HPDF_OCLASS_REAL;
        obj->error = mmgr->error;
        HPDF_Real_SetValue (obj, value);
    }

    return obj;
}